

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O3

btree_result
btree_init_and_load(btree *btree,void *blk_handle,btree_blk_ops *blk_ops,btree_kv_ops *kv_ops,
                   uint32_t nodesize,uint8_t ksize,uint8_t vsize,bnode_flag_t flag,btree_meta *meta,
                   uint64_t num_keys,btree_load_get_next_kv *next_kv,
                   btree_load_write_done *write_done,void *aux)

{
  ushort uVar1;
  ushort uVar2;
  idx_t iVar3;
  _func_voidref_void_ptr_bid_t_ptr *p_Var4;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var5;
  void *pvVar6;
  bid_t bVar7;
  ushort uVar8;
  ulong uVar9;
  bnode *pbVar10;
  bnode *pbVar11;
  btree_kv_ops *pbVar12;
  size_t sVar13;
  ulong uVar14;
  void **ppvVar15;
  void *pvVar16;
  ulong uVar17;
  bnode *node;
  size_t sVar18;
  size_t __n;
  void *pvVar19;
  undefined8 uStack_70;
  uint64_t local_68;
  void *local_60;
  ulong local_58;
  ulong local_50;
  void *local_48;
  void **local_40;
  void *val_to_insert;
  void *key_to_insert;
  
  btree->root_flag = flag | 1;
  btree->blk_ops = blk_ops;
  btree->blk_handle = blk_handle;
  btree->kv_ops = kv_ops;
  btree->height = 1;
  btree->blksize = nodesize;
  btree->ksize = ksize;
  btree->vsize = vsize;
  if (meta == (btree_meta *)0x0) {
    if (nodesize < 0x11) {
      return BTREE_RESULT_FAIL;
    }
    uVar14 = (ulong)vsize + (ulong)ksize;
    uVar9 = (nodesize - 0x11) / uVar14;
    uVar17 = 0x11;
    local_50 = uVar9;
  }
  else {
    btree->root_flag = flag | 3;
    uVar9 = (ulong)(meta->size + 0x11 & 0xfffffff0);
    uVar17 = uVar9 + 0x11;
    if (nodesize < uVar17) {
      return BTREE_RESULT_FAIL;
    }
    uVar14 = (ulong)vsize + (ulong)ksize;
    uVar9 = ((nodesize - uVar9) - 0x11) / uVar14;
    local_50 = (nodesize - 0x11) / uVar14;
  }
  if (uVar9 < num_keys) {
    uVar17 = 1;
    __n = 8;
    do {
      sVar18 = __n;
      uVar9 = uVar9 * local_50;
      uVar17 = uVar17 + 1;
      __n = sVar18 + 8;
    } while (uVar9 < num_keys);
    uVar9 = sVar18 + 0x17 & 0xfffffffffffffff0;
    pvVar16 = (void *)((long)&local_68 - uVar9);
    pvVar19 = (void *)((long)pvVar16 - uVar9);
    local_48 = pvVar16;
    *(undefined8 *)((long)pvVar19 + -8) = 0x10eeaf;
    memset(pvVar16,0,__n);
    local_60 = pvVar19;
    *(undefined8 *)((long)pvVar19 + -8) = 0x10eec0;
    memset(pvVar19,0,__n);
    pvVar19 = (void *)((long)pvVar19 - (ulong)(ksize + 0xf & 0xfffffff0));
    local_68 = 0;
    local_58 = uVar17;
    do {
      if (local_58 != 0) {
        uVar9 = 1;
        uVar17 = local_58;
        do {
          pbVar10 = *(bnode **)((long)local_48 + uVar9 * 8 + -8);
          if (pbVar10 == (bnode *)0x0) {
            val_to_insert = (void *)0x0;
            pvVar16 = btree->blk_handle;
            p_Var4 = btree->blk_ops->blk_alloc;
            *(undefined8 *)((long)pvVar19 + -8) = 0x10ef16;
            pbVar10 = (bnode *)(*p_Var4)(pvVar16,(bid_t *)&val_to_insert);
            if (uVar9 < local_58) {
              uVar1._0_1_ = btree->ksize;
              uVar1._1_1_ = btree->vsize;
              pbVar10->kvsize = uVar1 << 8 | uVar1 >> 8;
              pbVar10->nentry = 0;
              pbVar10->level = (uint16_t)uVar9;
              pbVar10->flag = 0;
              (pbVar10->field_4).data = pbVar10 + 1;
              *(bnode **)((long)local_48 + uVar9 * 8 + -8) = pbVar10;
            }
            else {
              uVar8._0_1_ = btree->ksize;
              uVar8._1_1_ = btree->vsize;
              uVar2 = btree->root_flag;
              pbVar10->kvsize = uVar8 << 8 | uVar8 >> 8;
              pbVar10->nentry = 0;
              pbVar10->level = (uint16_t)uVar9;
              pbVar10->flag = uVar2;
              pbVar11 = pbVar10;
              if ((uVar2 & 2) != 0 && meta != (btree_meta *)0x0) {
                pbVar10[1].kvsize = meta->size << 8 | meta->size >> 8;
                pvVar16 = meta->data;
                uVar8 = meta->size;
                *(undefined8 *)((long)pvVar19 + -8) = 0x10efab;
                memcpy(&pbVar10[1].flag,pvVar16,(ulong)uVar8);
                pbVar11 = (bnode *)((long)&pbVar10->kvsize + (ulong)(meta->size + 0x11 & 0xfffffff0)
                                   );
              }
              (pbVar10->field_4).data = pbVar11 + 1;
              *(bnode **)((long)local_48 + uVar9 * 8 + -8) = pbVar10;
              btree->root_bid = (bid_t)val_to_insert;
            }
            *(void **)((long)local_60 + uVar9 * 8 + -8) = val_to_insert;
          }
          if (uVar9 == 1) {
            val_to_insert = (void *)0x0;
            local_40 = (void **)0x0;
            *(undefined8 *)((long)pvVar19 + -8) = 0x10f005;
            (*next_kv)(&val_to_insert,&local_40,aux);
            pbVar12 = btree->kv_ops;
            iVar3 = pbVar10->nentry;
            ppvVar15 = local_40;
            pvVar16 = val_to_insert;
          }
          else {
            uVar14 = *(ulong *)((long)local_60 + uVar9 * 8 + -0x10);
            val_to_insert =
                 (void *)(uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
                          (uVar14 & 0xff0000000000) >> 0x18 | (uVar14 & 0xff00000000) >> 8 |
                          (uVar14 & 0xff000000) << 8 | (uVar14 & 0xff0000) << 0x18 |
                          (uVar14 & 0xff00) << 0x28 | uVar14 << 0x38);
            pbVar12 = btree->kv_ops;
            iVar3 = pbVar10->nentry;
            ppvVar15 = &val_to_insert;
            pvVar16 = pvVar19;
          }
          p_Var5 = pbVar12->set_kv;
          *(undefined8 *)((long)pvVar19 + -8) = 0x10f041;
          (*p_Var5)(pbVar10,iVar3,pvVar16,ppvVar15);
          pvVar16 = local_60;
          iVar3 = pbVar10->nentry;
          uVar8 = iVar3 + 1;
          pbVar10->nentry = uVar8;
          if (iVar3 != 0) {
            if ((uint)local_50 <= uVar8) {
              pvVar6 = btree->blk_handle;
              bVar7 = *(bid_t *)((long)local_60 + uVar9 * 8 + -8);
              *(undefined8 *)((long)pvVar19 + -8) = 0x10f08e;
              (*write_done)(pvVar6,bVar7,aux);
              *(undefined8 *)((long)local_48 + uVar9 * 8 + -8) = 0;
              *(undefined8 *)((long)pvVar16 + uVar9 * 8 + -8) = 0;
            }
            break;
          }
          p_Var5 = btree->kv_ops->get_kv;
          *(undefined8 *)((long)pvVar19 + -8) = 0x10f064;
          (*p_Var5)(pbVar10,0,pvVar19,(void *)0x0);
          uVar9 = uVar9 + 1;
          uVar17 = uVar17 - 1;
        } while (uVar17 != 0);
      }
      local_68 = local_68 + 1;
    } while (local_68 != num_keys);
  }
  else {
    if ((blk_ops->blk_alloc_sub == (_func_voidref_void_ptr_bid_t_ptr *)0x0) ||
       (blk_ops->blk_enlarge_node == (_func_voidref_void_ptr_bid_t_size_t_bid_t_ptr *)0x0)) {
      uStack_70 = 0x10f117;
      pbVar10 = (bnode *)(*blk_ops->blk_alloc)(blk_handle,&btree->root_bid);
    }
    else {
      uVar17 = uVar17 + uVar14 * num_keys;
      uStack_70 = 0x10f0dc;
      pbVar10 = (bnode *)(*blk_ops->blk_alloc_sub)(blk_handle,&btree->root_bid);
      uStack_70 = 0x10f0ee;
      sVar13 = (*btree->blk_ops->blk_get_size)(btree->blk_handle,btree->root_bid);
      if (sVar13 < uVar17) {
        uStack_70 = 0x10f108;
        pbVar10 = (bnode *)(*btree->blk_ops->blk_enlarge_node)
                                     (btree->blk_handle,btree->root_bid,uVar17,&btree->root_bid);
      }
    }
    uVar8 = btree->root_flag;
    uVar2._0_1_ = btree->ksize;
    uVar2._1_1_ = btree->vsize;
    pbVar10->kvsize = uVar2 << 8 | uVar2 >> 8;
    pbVar10->level = 1;
    pbVar10->nentry = 0;
    pbVar10->flag = uVar8;
    pbVar11 = pbVar10;
    if (meta != (btree_meta *)0x0 && (uVar8 & 2) != 0) {
      pbVar10[1].kvsize = meta->size << 8 | meta->size >> 8;
      uStack_70 = 0x10f165;
      memcpy(&pbVar10[1].flag,meta->data,(ulong)meta->size);
      pbVar11 = (bnode *)((long)&pbVar10->kvsize + (ulong)(meta->size + 0x11 & 0xfffffff0));
    }
    (pbVar10->field_4).data = pbVar11 + 1;
    if (num_keys != 0) {
      do {
        val_to_insert = (void *)0x0;
        local_40 = (void **)0x0;
        uStack_70 = 0x10f1ab;
        (*next_kv)(&val_to_insert,&local_40,aux);
        uStack_70 = 0x10f1c2;
        (*btree->kv_ops->set_kv)(pbVar10,pbVar10->nentry,val_to_insert,local_40);
        pbVar10->nentry = pbVar10->nentry + 1;
        num_keys = num_keys - 1;
      } while (num_keys != 0);
      return BTREE_RESULT_SUCCESS;
    }
  }
  return BTREE_RESULT_SUCCESS;
}

Assistant:

btree_result btree_init_and_load(
        struct btree *btree,
        void *blk_handle,
        struct btree_blk_ops *blk_ops,
        struct btree_kv_ops *kv_ops,
        uint32_t nodesize,
        uint8_t ksize,
        uint8_t vsize,
        bnode_flag_t flag,
        struct btree_meta *meta,
        uint64_t num_keys,
        btree_load_get_next_kv* next_kv,
        btree_load_write_done* write_done,
        void* aux)
{
    void *addr;
    size_t min_nodesize = 0;

    btree->root_flag = BNODE_MASK_ROOT | flag;
    btree->blk_ops = blk_ops;
    btree->blk_handle = blk_handle;
    btree->kv_ops = kv_ops;
    btree->height = 1;
    btree->blksize = nodesize;
    btree->ksize = ksize;
    btree->vsize = vsize;
    if (meta) {
        btree->root_flag |= BNODE_MASK_METADATA;
        min_nodesize = sizeof(struct bnode) + _metasize_align(meta->size) +
                       sizeof(metasize_t) + BLK_MARKER_SIZE;
    } else {
        min_nodesize = sizeof(struct bnode) + BLK_MARKER_SIZE;
    }

    if (min_nodesize > btree->blksize) {
        // too large metadata .. init fail
        return BTREE_RESULT_FAIL;
    }

    // Calculate max # key-values per node.
    size_t max_num_entries_non_root =
        (nodesize - sizeof(struct bnode) - BLK_MARKER_SIZE) / (ksize + vsize);
    size_t max_num_entries_root =
        meta
        ? ( nodesize - sizeof(struct bnode) - _metasize_align(meta->size) -
            sizeof(metasize_t) - BLK_MARKER_SIZE ) / (ksize + vsize)
        : max_num_entries_non_root;

    if (num_keys <= max_num_entries_root) {
        // Single height tree.
        size_t required_size = min_nodesize + num_keys * (ksize + vsize);
        if (btree->blk_ops->blk_alloc_sub && btree->blk_ops->blk_enlarge_node) {
            addr = btree->blk_ops->blk_alloc_sub(btree->blk_handle, &btree->root_bid);

            size_t subblock_size =
                btree->blk_ops->blk_get_size(btree->blk_handle,
                                             btree->root_bid);
            if (subblock_size < required_size) {
                addr = btree->blk_ops->blk_enlarge_node(btree->blk_handle,
                                                        btree->root_bid,
                                                        required_size,
                                                        &btree->root_bid);
            }
        } else {
            addr = btree->blk_ops->blk_alloc(btree->blk_handle, &btree->root_bid);
        }
        struct bnode* root_node =
            _btree_init_node( btree, btree->root_bid, addr,
                              btree->root_flag, 1, meta );

        // Put entries.
        for (uint64_t ii = 0; ii < num_keys; ++ii) {
            void* key_to_insert = nullptr;
            void* val_to_insert = nullptr;
            next_kv(&key_to_insert, &val_to_insert, aux);
            btree->kv_ops->set_kv( root_node, root_node->nentry,
                                   key_to_insert, val_to_insert );
            root_node->nentry++;
        }
        return BTREE_RESULT_SUCCESS;

    }

    // Otherwise: height >= 2, calculate the tree height.
    size_t exp_height = 2;
    uint64_t max_accomm_entries = max_num_entries_root * max_num_entries_non_root;
    while (max_accomm_entries < num_keys) {
        exp_height++;
        max_accomm_entries *= max_num_entries_non_root;
    }

    struct bnode** cur_node = alca(struct bnode*, exp_height);
    bid_t* node_bids = alca(bid_t, exp_height);
    memset(cur_node, 0x0, sizeof(struct bnode*) * exp_height);
    memset(node_bids, 0x0, sizeof(bid_t) * exp_height);

    uint8_t *k_in_child = alca(uint8_t, btree->ksize);

    for (uint64_t ii = 0; ii < num_keys; ++ii) {
        for (size_t jj = 0; jj < exp_height; ++jj) {
            if (!cur_node[jj]) {
                bid_t new_bid = 0;
                void* new_addr = btree->blk_ops->blk_alloc( btree->blk_handle,
                                                            &new_bid );
                if (jj + 1 < exp_height) {
                    cur_node[jj] = _btree_init_node( btree, new_bid, new_addr,
                                                     0x0, jj + 1, NULL );
                } else {
                    // Root node, should set the flags.
                    cur_node[jj] = _btree_init_node( btree, new_bid, new_addr,
                                                     btree->root_flag, jj + 1,
                                                     meta );
                    btree->root_bid = new_bid;
                }
                node_bids[jj] = new_bid;
            }

            if (jj == 0) {
                // Leaf node: {key, value}
                void* key_to_insert = nullptr;
                void* val_to_insert = nullptr;
                next_kv(&key_to_insert, &val_to_insert, aux);
                btree->kv_ops->set_kv( cur_node[jj], cur_node[jj]->nentry,
                                       key_to_insert, val_to_insert );
            } else {
                // Non-leaf node: {key, BID of child}
                bid_t enc_bid = _endian_encode(node_bids[jj - 1]);
                btree->kv_ops->set_kv( cur_node[jj], cur_node[jj]->nentry,
                                       k_in_child, &enc_bid );
            }

            cur_node[jj]->nentry++;
            if (cur_node[jj]->nentry == 1) {
                // Need to put the first entry to the parent node.
                btree->kv_ops->get_kv(cur_node[jj], 0, k_in_child, NULL);
            } else {
                if (cur_node[jj]->nentry >= max_num_entries_non_root) {
                    // Otherwise: full, should allocate a new one.
                    write_done(btree->blk_handle, node_bids[jj], aux);
                    cur_node[jj] = NULL;
                    node_bids[jj] = 0;
                }
                break;
            }
        }
    }

    return BTREE_RESULT_SUCCESS;
}